

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O3

void __thiscall Database::save(Database *this)

{
  size_type *psVar1;
  path *__p;
  _Rb_tree_header *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  value_t vVar4;
  pointer pcVar5;
  pointer ppOVar6;
  json_value jVar7;
  source_loc loc;
  long *plVar8;
  undefined8 *puVar9;
  string *__x;
  reference pvVar10;
  _Rb_tree_node_base *p_Var11;
  ostream *poVar12;
  logger *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  ulong *puVar14;
  pointer *ppbVar15;
  ulong uVar16;
  undefined8 uVar17;
  pointer ppOVar18;
  string_view_t fmt;
  path __result;
  json db_json;
  json iterators_json;
  string tmp_db_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dataset_names;
  path __result_2;
  ofstream db_file;
  undefined1 local_398 [64];
  undefined1 local_358 [8];
  json_value local_350;
  value_t local_348;
  json_value local_340;
  undefined1 local_338 [8];
  json_value local_330;
  value_t local_328;
  json_value local_320;
  value_t local_318;
  json_value local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  path local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  path local_290;
  undefined1 local_250 [8];
  json_value local_248;
  undefined1 local_240 [8];
  json_value local_238;
  ulong *local_230;
  long local_228;
  ulong local_220;
  undefined4 uStack_218;
  undefined4 auStack_214 [55];
  ios_base local_138 [264];
  
  random_hex_string_abi_cxx11_(&local_2e8._M_pathname,8);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,0x1ffda4);
  pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar8 + 2);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar8 == pbVar13) {
    local_398._16_8_ = (pbVar13->_M_dataplus)._M_p;
    local_398._24_8_ = plVar8[3];
    local_398._0_8_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_398 + 0x10);
  }
  else {
    local_398._16_8_ = (pbVar13->_M_dataplus)._M_p;
    local_398._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar8;
  }
  local_398._8_8_ = plVar8[1];
  *plVar8 = (long)pbVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append(local_398);
  puVar14 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar14) {
    local_220 = *puVar14;
    uStack_218 = (undefined4)plVar8[3];
    auStack_214[0] = *(undefined4 *)((long)plVar8 + 0x1c);
    local_230 = &local_220;
  }
  else {
    local_220 = *puVar14;
    local_230 = (ulong *)*plVar8;
  }
  local_228 = plVar8[1];
  *plVar8 = (long)puVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  pcVar5 = (this->db_name)._M_pathname._M_dataplus._M_p;
  paVar3 = &local_290._M_pathname.field_2;
  local_290._M_pathname._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_290,pcVar5,pcVar5 + (this->db_name)._M_pathname._M_string_length);
  uVar16 = 0xf;
  if (local_230 != &local_220) {
    uVar16 = local_220;
  }
  if (uVar16 < local_290._M_pathname._M_string_length + local_228) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_pathname._M_dataplus._M_p != paVar3) {
      uVar17 = local_290._M_pathname.field_2._M_allocated_capacity;
    }
    if (local_290._M_pathname._M_string_length + local_228 <= (ulong)uVar17) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_230);
      goto LAB_00149bf8;
    }
  }
  puVar9 = (undefined8 *)
           std::__cxx11::string::_M_append
                     ((char *)&local_230,(ulong)local_290._M_pathname._M_dataplus._M_p);
LAB_00149bf8:
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  psVar1 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_308.field_2._M_allocated_capacity = *psVar1;
    local_308.field_2._8_8_ = puVar9[3];
  }
  else {
    local_308.field_2._M_allocated_capacity = *psVar1;
    local_308._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_308._M_string_length = puVar9[1];
  *puVar9 = psVar1;
  puVar9[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_pathname._M_dataplus._M_p != paVar3) {
    operator_delete(local_290._M_pathname._M_dataplus._M_p,
                    local_290._M_pathname.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,local_220 + 1);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_398 + 0x10)) {
    operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_pathname._M_dataplus._M_p != &local_2e8._M_pathname.field_2) {
    operator_delete(local_2e8._M_pathname._M_dataplus._M_p,
                    local_2e8._M_pathname.field_2._M_allocated_capacity + 1);
  }
  std::ofstream::ofstream(&local_230);
  uVar16 = local_230[-3];
  *(undefined4 *)((long)auStack_214 + uVar16) = 1;
  std::ios::clear((int)&stack0xfffffffffffffc48 + (int)uVar16 + 0x188);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_2e8,&local_308)
  ;
  __p = &this->db_base;
  std::experimental::filesystem::v1::__cxx11::path::path((path *)local_398,__p);
  std::experimental::filesystem::v1::__cxx11::path::_M_append
            ((path *)local_398,&local_2e8._M_pathname);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)local_398._0_8_);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_398);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_2e8);
  local_358[0] = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  )0x0;
  local_350.object = (object_t *)0x0;
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppOVar18 = (this->working_datasets).
             super__Vector_base<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppOVar6 = (this->working_datasets).
            super__Vector_base<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppOVar18 != ppOVar6) {
    do {
      __x = OnDiskDataset::get_name_abi_cxx11_(*ppOVar18);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_2a8,__x);
      ppOVar18 = ppOVar18 + 1;
    } while (ppOVar18 != ppOVar6);
  }
  local_310.object = (object_t *)0x0;
  local_318 = array;
  local_398._0_8_ =
       local_2a8.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_2e8._M_pathname._M_dataplus._M_p =
       (pointer)local_2a8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_310.object =
       (object_t *)
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::
       create<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                 ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_398,
                  (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_2e8);
  pvVar10 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)local_358,"datasets");
  vVar4 = pvVar10->m_type;
  pvVar10->m_type = local_318;
  jVar7 = pvVar10->m_value;
  (pvVar10->m_value).object = (object_t *)local_310;
  local_318 = vVar4;
  local_310 = jVar7;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)&local_310.boolean,vVar4);
  local_398._0_8_ = local_398 + 0x30;
  local_398._8_8_ = 1;
  local_398._16_8_ = 0;
  local_398._24_8_ = (pointer)0x0;
  local_398._32_8_ = (pointer)0x3f800000;
  local_398._40_8_ = (pointer)0x0;
  local_398._48_8_ = (pointer)0x0;
  local_330.object = (object_t *)0x0;
  local_338[0] = object;
  local_2e8._M_pathname._M_dataplus._M_p = (pointer)0x0;
  local_290._M_pathname._M_dataplus._M_p = (pointer)0x0;
  local_330.object =
       nlohmann::
       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
       ::
       create<std::map<std::__cxx11::string,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>,std::__detail::_Node_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>,false,true>,std::__detail::_Node_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>,false,true>>
                 ((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                   *)&local_2e8,
                  (_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                   *)&local_290);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_398);
  p_Var11 = (this->iterators)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->iterators)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var11 != p_Var2) {
    do {
      local_340.object = (object_t *)0x0;
      local_348 = string;
      local_340.object =
           (object_t *)
           nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::create<std::__cxx11::string,std::__cxx11::string_const&>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (p_Var11 + 6));
      pvVar10 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_338,(key_type *)(p_Var11 + 1));
      vVar4 = pvVar10->m_type;
      pvVar10->m_type = local_348;
      jVar7 = pvVar10->m_value;
      (pvVar10->m_value).object = (object_t *)local_340;
      local_348 = vVar4;
      local_340 = jVar7;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::json_value::destroy((json_value *)&local_340.boolean,vVar4);
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != p_Var2);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_240,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_338);
  pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_398 + 0x10);
  pvVar10 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)local_358,"iterators");
  vVar4 = pvVar10->m_type;
  pvVar10->m_type = local_240[0];
  jVar7 = pvVar10->m_value;
  pvVar10->m_value = local_238;
  local_240[0] = vVar4;
  local_238 = jVar7;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_240 + 8),vVar4);
  local_398._16_6_ = 0x302e352e31;
  local_398._8_8_ = (pointer)0x5;
  local_320.object = (object_t *)0x0;
  local_328 = string;
  local_398._0_8_ = pbVar13;
  local_320.object = (object_t *)operator_new(0x20);
  ppbVar15 = &((local_320.array)->
              super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage;
  ((local_320.array)->
  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar15;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398._0_8_ ==
      pbVar13) {
    *ppbVar15 = (pointer)local_398._16_8_;
    local_320.array[1].
    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_398._24_8_;
  }
  else {
    ((local_320.array)->
    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)local_398._0_8_;
    ((local_320.array)->
    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_398._16_8_;
  }
  ((local_320.array)->
  super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)local_398._8_8_;
  local_398._8_8_ = 0;
  local_398._16_8_ = local_398._16_8_ & 0xffffffffffffff00;
  local_398._0_8_ = pbVar13;
  pvVar10 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)local_358,"version");
  vVar4 = pvVar10->m_type;
  pvVar10->m_type = local_328;
  jVar7 = pvVar10->m_value;
  (pvVar10->m_value).array = (array_t *)local_320;
  local_328 = vVar4;
  local_320 = jVar7;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)&local_320.boolean,vVar4);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398._0_8_ !=
      pbVar13) {
    operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_250,&(this->config_).config_);
  pvVar10 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)local_358,"config");
  vVar4 = pvVar10->m_type;
  pvVar10->m_type = local_250[0];
  jVar7 = pvVar10->m_value;
  pvVar10->m_value = local_248;
  local_250[0] = vVar4;
  local_248 = jVar7;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_250 + 8),vVar4);
  *(undefined8 *)((long)&local_220 + local_230[-3]) = 4;
  poVar12 = nlohmann::operator<<
                      ((ostream *)&local_230,
                       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_358);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
  std::ostream::put((char)poVar12);
  std::ostream::flush();
  std::ostream::flush();
  std::ofstream::close();
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&local_2e8,&local_308)
  ;
  std::experimental::filesystem::v1::__cxx11::path::path((path *)local_398,__p);
  std::experimental::filesystem::v1::__cxx11::path::_M_append
            ((path *)local_398,&local_2e8._M_pathname);
  std::experimental::filesystem::v1::__cxx11::path::path(&local_290,__p);
  std::experimental::filesystem::v1::__cxx11::path::_M_append(&local_290,(string_type *)this);
  std::experimental::filesystem::v1::rename((path *)local_398,&local_290);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_290);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)local_398);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_2e8);
  pcVar5 = (this->db_name)._M_pathname._M_dataplus._M_p;
  local_398._0_8_ = pbVar13;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_398,pcVar5,pcVar5 + (this->db_name)._M_pathname._M_string_length);
  this_00 = spdlog::default_logger_raw();
  local_2e8._M_pathname._M_dataplus._M_p = (pointer)0x0;
  local_2e8._M_pathname._M_string_length = 0;
  local_2e8._M_pathname.field_2._M_allocated_capacity = 0;
  loc.funcname = (char *)0x0;
  loc.filename = (char *)0x0;
  loc.line = 0;
  loc._12_4_ = 0;
  fmt.size_ = 8;
  fmt.data_ = "SAVE: {}";
  spdlog::logger::log<std::__cxx11::string>
            (this_00,loc,info,fmt,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398._0_8_ !=
      pbVar13) {
    operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_338 + 8),local_338[0]);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2a8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_358 + 8),(value_t)local_358[0]);
  local_230 = _VTT;
  *(undefined8 *)((long)&local_230 + _VTT[-3]) = _pthread_mutex_unlock;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Database::save() {
    std::string tmp_db_name =
        "tmp-" + random_hex_string(8) + "-" + db_name.string();
    std::ofstream db_file;
    db_file.exceptions(std::ofstream::badbit);
    db_file.open(db_base / tmp_db_name, std::ofstream::binary);

    json db_json;
    std::vector<std::string> dataset_names;
    for (const auto *ds : working_datasets) {
        dataset_names.push_back(ds->get_name());
    }
    db_json["datasets"] = dataset_names;

    json iterators_json = std::unordered_map<std::string, std::string>();
    for (const auto &it : iterators) {
        iterators_json[it.first] = it.second.get_name().get_filename();
    }
    db_json["iterators"] = iterators_json;
    db_json["version"] = std::string(ursadb_format_version);

    db_json["config"] = config_.get_raw();

    db_file << std::setw(4) << db_json << std::endl;
    db_file.flush();
    db_file.close();

    fs::rename(db_base / tmp_db_name, db_base / db_name);
    spdlog::info("SAVE: {}", std::string(db_name));
}